

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

lzham_decompress_status_t
lzham::lzham_lib_decompress_memory
          (lzham_decompress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  undefined4 uVar1;
  lzham_decompress_status_t lVar2;
  uint32 uVar3;
  lzham_decompress_state_ptr p;
  lzham_decompress_params params;
  size_t local_50;
  lzham_decompress_params local_48;
  
  if (pParams == (lzham_decompress_params *)0x0) {
    lVar2 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  else {
    local_48.m_struct_size = pParams->m_struct_size;
    local_48.m_dict_size_log2 = pParams->m_dict_size_log2;
    uVar1 = pParams->m_compute_adler32;
    local_48.m_compute_adler32 = uVar1;
    local_48.m_output_unbuffered = 1;
    local_50 = src_len;
    p = lzham_lib_decompress_init(&local_48);
    if (p == (lzham_decompress_state_ptr)0x0) {
      lVar2 = LZHAM_DECOMP_STATUS_FAILED;
    }
    else {
      lVar2 = lzham_lib_decompress(p,pSrc_buf,&local_50,pDst_buf,pDst_len,1);
      uVar3 = lzham_lib_decompress_deinit(p);
      if (pAdler32 != (lzham_uint32 *)0x0) {
        *pAdler32 = uVar3;
      }
    }
  }
  return lVar2;
}

Assistant:

lzham_decompress_status_t lzham_lib_decompress_memory(const lzham_decompress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if (!pParams)
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;

      lzham_decompress_params params(*pParams);
      params.m_output_unbuffered = true;

      lzham_decompress_state_ptr pState = lzham_lib_decompress_init(&params);
      if (!pState)
         return LZHAM_DECOMP_STATUS_FAILED;

      lzham_decompress_status_t status = lzham_lib_decompress(pState, pSrc_buf, &src_len, pDst_buf, pDst_len, true);

      uint32 adler32 = lzham_lib_decompress_deinit(pState);
      if (pAdler32)
         *pAdler32 = adler32;

      return status;
   }